

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderAtomicOpTests.cpp
# Opt level: O2

int __thiscall
deqp::gles31::Functional::ShaderAtomicOpTests::init(ShaderAtomicOpTests *this,EVP_PKEY_CTX *ctx)

{
  Context *pCVar1;
  TestContext *pTVar2;
  ShaderAtomicOpTests *pSVar3;
  int extraout_EAX;
  char *pcVar4;
  TestNode *pTVar5;
  ShaderAtomicCompSwapCase *this_00;
  int iVar6;
  Precision PVar7;
  DataType DVar8;
  bool bVar9;
  allocator<char> local_b1;
  TestNode *local_b0;
  AtomicOperandType local_a4;
  Context *local_a0;
  string caseName;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  ShaderAtomicOpTests *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pCVar1 = (this->super_TestCaseGroup).m_context;
  local_a4 = this->m_operandType;
  local_58 = this;
  local_b0 = (TestNode *)operator_new(0x70);
  pTVar2 = pCVar1->m_testCtx;
  local_a0 = pCVar1;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"Atomic ",(allocator<char> *)&local_50);
  std::operator+(&caseName,&local_78,"add");
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)local_b0,pTVar2,"add",caseName._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&caseName);
  std::__cxx11::string::~string((string *)&local_78);
  for (PVar7 = PRECISION_LOWP; pSVar3 = local_58, PVar7 != PRECISION_LAST;
      PVar7 = PVar7 + PRECISION_MEDIUMP) {
    iVar6 = 2;
    while( true ) {
      bVar9 = iVar6 == 0;
      iVar6 = iVar6 + -1;
      if (bVar9) break;
      pcVar4 = glu::getPrecisionName(PVar7);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,pcVar4,&local_b1);
      std::operator+(&local_78,&local_50,"_");
      DVar8 = (uint)(iVar6 != 0) * 4 + TYPE_INT;
      pcVar4 = glu::getDataTypeName(DVar8);
      std::operator+(&caseName,&local_78,pcVar4);
      std::__cxx11::string::~string((string *)&local_78);
      std::__cxx11::string::~string((string *)&local_50);
      pTVar5 = (TestNode *)operator_new(200);
      ShaderAtomicAddCase::ShaderAtomicAddCase
                ((ShaderAtomicAddCase *)pTVar5,local_a0,caseName._M_dataplus._M_p,local_a4,DVar8,
                 PVar7);
      tcu::TestNode::addChild(local_b0,pTVar5);
      std::__cxx11::string::~string((string *)&caseName);
    }
  }
  tcu::TestNode::addChild((TestNode *)local_58,local_b0);
  pCVar1 = (pSVar3->super_TestCaseGroup).m_context;
  local_a4 = pSVar3->m_operandType;
  local_b0 = (TestNode *)operator_new(0x70);
  pTVar2 = pCVar1->m_testCtx;
  local_a0 = pCVar1;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"Atomic ",(allocator<char> *)&local_50);
  std::operator+(&caseName,&local_78,"min");
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)local_b0,pTVar2,"min",caseName._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&caseName);
  std::__cxx11::string::~string((string *)&local_78);
  for (PVar7 = PRECISION_LOWP; pSVar3 = local_58, PVar7 != PRECISION_LAST;
      PVar7 = PVar7 + PRECISION_MEDIUMP) {
    iVar6 = 2;
    while( true ) {
      bVar9 = iVar6 == 0;
      iVar6 = iVar6 + -1;
      if (bVar9) break;
      pcVar4 = glu::getPrecisionName(PVar7);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,pcVar4,&local_b1);
      std::operator+(&local_78,&local_50,"_");
      DVar8 = (uint)(iVar6 != 0) * 4 + TYPE_INT;
      pcVar4 = glu::getDataTypeName(DVar8);
      std::operator+(&caseName,&local_78,pcVar4);
      std::__cxx11::string::~string((string *)&local_78);
      std::__cxx11::string::~string((string *)&local_50);
      pTVar5 = (TestNode *)operator_new(200);
      ShaderAtomicMinCase::ShaderAtomicMinCase
                ((ShaderAtomicMinCase *)pTVar5,local_a0,caseName._M_dataplus._M_p,local_a4,DVar8,
                 PVar7);
      tcu::TestNode::addChild(local_b0,pTVar5);
      std::__cxx11::string::~string((string *)&caseName);
    }
  }
  tcu::TestNode::addChild((TestNode *)local_58,local_b0);
  pCVar1 = (pSVar3->super_TestCaseGroup).m_context;
  local_a4 = pSVar3->m_operandType;
  local_b0 = (TestNode *)operator_new(0x70);
  pTVar2 = pCVar1->m_testCtx;
  local_a0 = pCVar1;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"Atomic ",(allocator<char> *)&local_50);
  std::operator+(&caseName,&local_78,"max");
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)local_b0,pTVar2,"max",caseName._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&caseName);
  std::__cxx11::string::~string((string *)&local_78);
  for (PVar7 = PRECISION_LOWP; pSVar3 = local_58, PVar7 != PRECISION_LAST;
      PVar7 = PVar7 + PRECISION_MEDIUMP) {
    iVar6 = 2;
    while( true ) {
      bVar9 = iVar6 == 0;
      iVar6 = iVar6 + -1;
      if (bVar9) break;
      pcVar4 = glu::getPrecisionName(PVar7);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,pcVar4,&local_b1);
      std::operator+(&local_78,&local_50,"_");
      DVar8 = (uint)(iVar6 != 0) * 4 + TYPE_INT;
      pcVar4 = glu::getDataTypeName(DVar8);
      std::operator+(&caseName,&local_78,pcVar4);
      std::__cxx11::string::~string((string *)&local_78);
      std::__cxx11::string::~string((string *)&local_50);
      pTVar5 = (TestNode *)operator_new(200);
      ShaderAtomicMaxCase::ShaderAtomicMaxCase
                ((ShaderAtomicMaxCase *)pTVar5,local_a0,caseName._M_dataplus._M_p,local_a4,DVar8,
                 PVar7);
      tcu::TestNode::addChild(local_b0,pTVar5);
      std::__cxx11::string::~string((string *)&caseName);
    }
  }
  tcu::TestNode::addChild((TestNode *)local_58,local_b0);
  pCVar1 = (pSVar3->super_TestCaseGroup).m_context;
  local_a4 = pSVar3->m_operandType;
  local_b0 = (TestNode *)operator_new(0x70);
  pTVar2 = pCVar1->m_testCtx;
  local_a0 = pCVar1;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"Atomic ",(allocator<char> *)&local_50);
  std::operator+(&caseName,&local_78,"and");
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)local_b0,pTVar2,"and",caseName._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&caseName);
  std::__cxx11::string::~string((string *)&local_78);
  for (PVar7 = PRECISION_LOWP; pSVar3 = local_58, PVar7 != PRECISION_LAST;
      PVar7 = PVar7 + PRECISION_MEDIUMP) {
    iVar6 = 2;
    while( true ) {
      bVar9 = iVar6 == 0;
      iVar6 = iVar6 + -1;
      if (bVar9) break;
      pcVar4 = glu::getPrecisionName(PVar7);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,pcVar4,&local_b1);
      std::operator+(&local_78,&local_50,"_");
      DVar8 = (uint)(iVar6 != 0) * 4 + TYPE_INT;
      pcVar4 = glu::getDataTypeName(DVar8);
      std::operator+(&caseName,&local_78,pcVar4);
      std::__cxx11::string::~string((string *)&local_78);
      std::__cxx11::string::~string((string *)&local_50);
      pTVar5 = (TestNode *)operator_new(200);
      ShaderAtomicAndCase::ShaderAtomicAndCase
                ((ShaderAtomicAndCase *)pTVar5,local_a0,caseName._M_dataplus._M_p,local_a4,DVar8,
                 PVar7);
      tcu::TestNode::addChild(local_b0,pTVar5);
      std::__cxx11::string::~string((string *)&caseName);
    }
  }
  tcu::TestNode::addChild((TestNode *)local_58,local_b0);
  pCVar1 = (pSVar3->super_TestCaseGroup).m_context;
  local_a4 = pSVar3->m_operandType;
  local_b0 = (TestNode *)operator_new(0x70);
  pTVar2 = pCVar1->m_testCtx;
  local_a0 = pCVar1;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"Atomic ",(allocator<char> *)&local_50);
  std::operator+(&caseName,&local_78,"or");
  tcu::TestCaseGroup::TestCaseGroup((TestCaseGroup *)local_b0,pTVar2,"or",caseName._M_dataplus._M_p)
  ;
  std::__cxx11::string::~string((string *)&caseName);
  std::__cxx11::string::~string((string *)&local_78);
  for (PVar7 = PRECISION_LOWP; pSVar3 = local_58, PVar7 != PRECISION_LAST;
      PVar7 = PVar7 + PRECISION_MEDIUMP) {
    iVar6 = 2;
    while( true ) {
      bVar9 = iVar6 == 0;
      iVar6 = iVar6 + -1;
      if (bVar9) break;
      pcVar4 = glu::getPrecisionName(PVar7);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,pcVar4,&local_b1);
      std::operator+(&local_78,&local_50,"_");
      DVar8 = (uint)(iVar6 != 0) * 4 + TYPE_INT;
      pcVar4 = glu::getDataTypeName(DVar8);
      std::operator+(&caseName,&local_78,pcVar4);
      std::__cxx11::string::~string((string *)&local_78);
      std::__cxx11::string::~string((string *)&local_50);
      pTVar5 = (TestNode *)operator_new(200);
      ShaderAtomicOrCase::ShaderAtomicOrCase
                ((ShaderAtomicOrCase *)pTVar5,local_a0,caseName._M_dataplus._M_p,local_a4,DVar8,
                 PVar7);
      tcu::TestNode::addChild(local_b0,pTVar5);
      std::__cxx11::string::~string((string *)&caseName);
    }
  }
  tcu::TestNode::addChild((TestNode *)local_58,local_b0);
  pCVar1 = (pSVar3->super_TestCaseGroup).m_context;
  local_a4 = pSVar3->m_operandType;
  local_b0 = (TestNode *)operator_new(0x70);
  pTVar2 = pCVar1->m_testCtx;
  local_a0 = pCVar1;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"Atomic ",(allocator<char> *)&local_50);
  std::operator+(&caseName,&local_78,"xor");
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)local_b0,pTVar2,"xor",caseName._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&caseName);
  std::__cxx11::string::~string((string *)&local_78);
  for (PVar7 = PRECISION_LOWP; pSVar3 = local_58, PVar7 != PRECISION_LAST;
      PVar7 = PVar7 + PRECISION_MEDIUMP) {
    iVar6 = 2;
    while( true ) {
      bVar9 = iVar6 == 0;
      iVar6 = iVar6 + -1;
      if (bVar9) break;
      pcVar4 = glu::getPrecisionName(PVar7);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,pcVar4,&local_b1);
      std::operator+(&local_78,&local_50,"_");
      DVar8 = (uint)(iVar6 != 0) * 4 + TYPE_INT;
      pcVar4 = glu::getDataTypeName(DVar8);
      std::operator+(&caseName,&local_78,pcVar4);
      std::__cxx11::string::~string((string *)&local_78);
      std::__cxx11::string::~string((string *)&local_50);
      pTVar5 = (TestNode *)operator_new(200);
      ShaderAtomicXorCase::ShaderAtomicXorCase
                ((ShaderAtomicXorCase *)pTVar5,local_a0,caseName._M_dataplus._M_p,local_a4,DVar8,
                 PVar7);
      tcu::TestNode::addChild(local_b0,pTVar5);
      std::__cxx11::string::~string((string *)&caseName);
    }
  }
  tcu::TestNode::addChild((TestNode *)local_58,local_b0);
  pCVar1 = (pSVar3->super_TestCaseGroup).m_context;
  local_a4 = pSVar3->m_operandType;
  local_b0 = (TestNode *)operator_new(0x70);
  pTVar2 = pCVar1->m_testCtx;
  local_a0 = pCVar1;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"Atomic ",(allocator<char> *)&local_50);
  std::operator+(&caseName,&local_78,"exchange");
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)local_b0,pTVar2,"exchange",caseName._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&caseName);
  std::__cxx11::string::~string((string *)&local_78);
  for (PVar7 = PRECISION_LOWP; pSVar3 = local_58, PVar7 != PRECISION_LAST;
      PVar7 = PVar7 + PRECISION_MEDIUMP) {
    iVar6 = 2;
    while( true ) {
      bVar9 = iVar6 == 0;
      iVar6 = iVar6 + -1;
      if (bVar9) break;
      pcVar4 = glu::getPrecisionName(PVar7);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,pcVar4,&local_b1);
      std::operator+(&local_78,&local_50,"_");
      DVar8 = (uint)(iVar6 != 0) * 4 + TYPE_INT;
      pcVar4 = glu::getDataTypeName(DVar8);
      std::operator+(&caseName,&local_78,pcVar4);
      std::__cxx11::string::~string((string *)&local_78);
      std::__cxx11::string::~string((string *)&local_50);
      pTVar5 = (TestNode *)operator_new(200);
      ShaderAtomicExchangeCase::ShaderAtomicExchangeCase
                ((ShaderAtomicExchangeCase *)pTVar5,local_a0,caseName._M_dataplus._M_p,local_a4,
                 DVar8,PVar7);
      tcu::TestNode::addChild(local_b0,pTVar5);
      std::__cxx11::string::~string((string *)&caseName);
    }
  }
  tcu::TestNode::addChild((TestNode *)local_58,local_b0);
  pCVar1 = (pSVar3->super_TestCaseGroup).m_context;
  local_a4 = pSVar3->m_operandType;
  local_b0 = (TestNode *)operator_new(0x70);
  pTVar2 = pCVar1->m_testCtx;
  local_a0 = pCVar1;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"Atomic ",(allocator<char> *)&local_50);
  std::operator+(&caseName,&local_78,"compswap");
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)local_b0,pTVar2,"compswap",caseName._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&caseName);
  std::__cxx11::string::~string((string *)&local_78);
  for (PVar7 = PRECISION_LOWP; PVar7 != PRECISION_LAST; PVar7 = PVar7 + PRECISION_MEDIUMP) {
    iVar6 = 2;
    while( true ) {
      bVar9 = iVar6 == 0;
      iVar6 = iVar6 + -1;
      if (bVar9) break;
      pcVar4 = glu::getPrecisionName(PVar7);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,pcVar4,&local_b1);
      std::operator+(&local_78,&local_50,"_");
      DVar8 = (uint)(iVar6 != 0) * 4 + TYPE_INT;
      pcVar4 = glu::getDataTypeName(DVar8);
      std::operator+(&caseName,&local_78,pcVar4);
      std::__cxx11::string::~string((string *)&local_78);
      std::__cxx11::string::~string((string *)&local_50);
      this_00 = (ShaderAtomicCompSwapCase *)operator_new(0xa8);
      ShaderAtomicCompSwapCase::ShaderAtomicCompSwapCase
                (this_00,local_a0,caseName._M_dataplus._M_p,local_a4,DVar8,PVar7);
      tcu::TestNode::addChild(local_b0,(TestNode *)this_00);
      std::__cxx11::string::~string((string *)&caseName);
    }
  }
  tcu::TestNode::addChild((TestNode *)local_58,local_b0);
  return extraout_EAX;
}

Assistant:

void ShaderAtomicOpTests::init (void)
{
	addChild(createAtomicOpGroup<ShaderAtomicAddCase>		(m_context, m_operandType, "add"));
	addChild(createAtomicOpGroup<ShaderAtomicMinCase>		(m_context, m_operandType, "min"));
	addChild(createAtomicOpGroup<ShaderAtomicMaxCase>		(m_context, m_operandType, "max"));
	addChild(createAtomicOpGroup<ShaderAtomicAndCase>		(m_context, m_operandType, "and"));
	addChild(createAtomicOpGroup<ShaderAtomicOrCase>		(m_context, m_operandType, "or"));
	addChild(createAtomicOpGroup<ShaderAtomicXorCase>		(m_context, m_operandType, "xor"));
	addChild(createAtomicOpGroup<ShaderAtomicExchangeCase>	(m_context, m_operandType, "exchange"));
	addChild(createAtomicOpGroup<ShaderAtomicCompSwapCase>	(m_context, m_operandType, "compswap"));
}